

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall embree::MirrorMaterial::MirrorMaterial(MirrorMaterial *this,Vec3fa *reflectance)

{
  size_type sVar1;
  undefined8 *in_RSI;
  string *in_RDI;
  allocator *this_00;
  allocator local_41;
  string local_40 [32];
  undefined8 *local_20;
  
  this_00 = &local_41;
  local_20 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",this_00);
  SceneGraph::MaterialNode::MaterialNode((MaterialNode *)this_00,in_RDI);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *(undefined ***)in_RDI = &PTR__MirrorMaterial_00607be8;
  Material::Material((Material *)&in_RDI[3].field_2,MATERIAL_MIRROR);
  sVar1 = local_20[1];
  *(undefined8 *)(in_RDI + 4) = *local_20;
  in_RDI[4]._M_string_length = sVar1;
  return;
}

Assistant:

MirrorMaterial (const Vec3fa& reflectance)
      : base(MATERIAL_MIRROR), reflectance(reflectance) {}